

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O1

ulong __thiscall CVmSrcfEntry::find_src_addr(CVmSrcfEntry *this,ulong *linenum,int exact)

{
  ulong uVar1;
  ulong in_RAX;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  if (this->lines_cnt_ == 0) {
    return 0;
  }
  lVar2 = this->lines_cnt_ - 1;
  lVar4 = 0;
  do {
    if (lVar2 < lVar4) {
      return 0;
    }
    lVar3 = (lVar2 - lVar4) / 2 + lVar4;
    if (exact == 0) {
      if (lVar3 == 0) {
        bVar5 = *linenum <= this->lines_->linenum;
      }
      else {
        uVar1 = *linenum;
        if (lVar3 == this->lines_cnt_ - 1) {
          bVar5 = this->lines_[lVar3].linenum <= uVar1;
        }
        else if (this->lines_[lVar3].linenum < uVar1) {
          bVar5 = false;
        }
        else {
          bVar5 = this->lines_[lVar3 + -1].linenum < uVar1;
        }
      }
    }
    else {
      bVar5 = this->lines_[lVar3].linenum == *linenum;
    }
    if (bVar5) {
      *linenum = this->lines_[lVar3].linenum;
      in_RAX = this->lines_[lVar3].code_addr;
    }
    else if (this->lines_[lVar3].linenum < *linenum) {
      lVar4 = lVar3 + (ulong)((lVar2 - lVar4) + 1U < 3);
    }
    else {
      bVar6 = lVar3 != lVar2;
      lVar2 = lVar2 + -1;
      if (bVar6) {
        lVar2 = lVar3;
      }
    }
  } while (!bVar5);
  return in_RAX;
}

Assistant:

ulong CVmSrcfEntry::find_src_addr(ulong *linenum, int exact)
{
    long hi, lo, cur;

    /* if there are no line records, return failure */
    if (lines_cnt_ == 0)
        return 0;

    /* perform a binary search of the line record array */
    lo = 0;
    hi =  (long)lines_cnt_ - 1;
    while (lo <= hi)
    {
        int match;
        
        /* split the difference */
        cur = lo + (hi - lo)/2;

        /* 
         *   Check for a match.  If they require an exact match, we must
         *   find the line number exactly.  Otherwise, check to see if
         *   this is the next executable line after the given line. 
         */
        if (exact)
        {
            /* exact match required */
            match = (lines_[cur].linenum == *linenum);
        }
        else
        {
            /* 
             *   exact match not required - match if this is the next
             *   executable line after the requested line, or this is the
             *   last executable line and the requested line is higher 
             */
            if (cur == 0)
            {
                /* 
                 *   this is the first executable line - if the requested
                 *   line is before this one, this is our match 
                 */
                match = (*linenum <= lines_[cur].linenum);
            }
            else if (cur == (long)lines_cnt_ - 1)
            {
                /* 
                 *   this is the last executable line - if the requested
                 *   line is after this one, this is our match 
                 */
                match = (*linenum >= lines_[cur].linenum);
            }
            else
            {
                /* 
                 *   we're somewhere in the middle of the file - if the
                 *   requested line is before this one, but after the
                 *   previous executable line, this is our match 
                 */
                match = (*linenum <= lines_[cur].linenum
                         && *linenum > lines_[cur - 1].linenum);
            }
        }

        /* if we have a match, return it; otherwise, keep searching */
        if (match)
        {
            /* 
             *   if this is a non-exact match, update the caller's line
             *   number with the actual line number we found 
             */
            *linenum = lines_[cur].linenum;
            
            /* return our code address */
            return lines_[cur].code_addr;
        }
        else if (*linenum > lines_[cur].linenum)
        {
            /* we need to go higher */
            lo = (cur == lo ? cur + 1 : cur);
        }
        else
        {
            /* we need to go lower */
            hi = (cur == hi ? hi - 1 : cur);
        }
    }

    /* failure */
    return 0;
}